

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsEval.c
# Opt level: O3

void SourceElements_eval(JsAstNode *na,JsContext *context,JsValue *res)

{
  undefined8 *puVar1;
  
  res->type = JS_COMPLETION;
  (res->u).completion.type = JS_COMPLETION_NORMAL;
  (res->u).number = 0.0;
  puVar1 = *(undefined8 **)(na + 1);
  while ((puVar1 != (undefined8 *)0x0 &&
         ((*JsNodeClassEval[((JsAstNode *)*puVar1)->astClass])((JsAstNode *)*puVar1,context,res),
         (res->u).completion.type == JS_COMPLETION_NORMAL))) {
    puVar1 = (undefined8 *)puVar1[1];
  }
  return;
}

Assistant:

static void
SourceElements_eval(na, context, res)
	struct JsAstNode *na; /* (struct SourceElements_node) */
	struct JsContext *context;
	struct JsValue *res;
{
	struct JsAstSourceElementsNode *n = CAST_NODE(na, JsAstSourceElementsNode);
	struct JsAstSourceElement *e;

	/*
	 * NB: strictly, this should 'evaluate' the
	 * FunctionDeclarations, but they only yield <NORMAL, NULL, NULL>
	 * so, we don't. We just run the non-functiondecl statements
	 * instead. It has the same result.
	 */
	JS_SET_COMPLETION(res,JS_COMPLETION_NORMAL, NULL);
	for (e = n->statements; e; e = e->next) {
		EVAL(e->node, context, res);
		if (res->u.completion.type != JS_COMPLETION_NORMAL)
			break;
	}
}